

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrittenFontTrueType.cpp
# Opt level: O2

bool __thiscall
WrittenFontTrueType::AddANSICandidates
          (WrittenFontTrueType *this,GlyphUnicodeMappingList *inGlyphsList,UShortList *ioCandidates)

{
  unsigned_long inUnicodeCharacter;
  BoolAndByte BVar1;
  undefined8 in_RAX;
  bool bVar2;
  _List_node_base *p_Var3;
  WinAnsiEncoding winAnsiEncoding;
  undefined8 uStack_38;
  
  if (this->fontSupportsWinAnsiEncoding == true) {
    uStack_38 = in_RAX;
    WinAnsiEncoding::WinAnsiEncoding((WinAnsiEncoding *)((long)&uStack_38 + 5));
    bVar2 = true;
    p_Var3 = (_List_node_base *)inGlyphsList;
    while ((p_Var3 = (((_List_base<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_> *)
                      &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
           p_Var3 != (_List_node_base *)inGlyphsList && (bVar2))) {
      bVar2 = false;
      if ((long)p_Var3[1]._M_prev - (long)p_Var3[1]._M_next == 8) {
        inUnicodeCharacter = *(unsigned_long *)p_Var3[1]._M_next;
        bVar2 = false;
        if (inUnicodeCharacter != 0x2022) {
          BVar1 = WinAnsiEncoding::Encode
                            ((WinAnsiEncoding *)((long)&uStack_38 + 5),inUnicodeCharacter);
          bVar2 = false;
          if (((ushort)BVar1 & 1) != 0) {
            uStack_38 = CONCAT26((ushort)BVar1 >> 8,(undefined6)uStack_38);
            std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                      (ioCandidates,(value_type_conflict4 *)((long)&uStack_38 + 6));
            bVar2 = true;
          }
        }
      }
    }
    WinAnsiEncoding::~WinAnsiEncoding((WinAnsiEncoding *)((long)&uStack_38 + 5));
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool WrittenFontTrueType::AddANSICandidates(const GlyphUnicodeMappingList& inGlyphsList, UShortList& ioCandidates) {
	if(!fontSupportsWinAnsiEncoding) {
		return false;
	}

	// i'm totally relying on the text here, which is fine till i'll do ligatures, in which case
	// i'll need to make something different out of the text.
	// as you can see this has little to do with glyphs (mainly cause i can't use FreeType to map the glyphs
	// back to the rleevant unicode values...but no need anyways...that's why i carry the text).
	BoolAndByte encodingResult(true,0);
	WinAnsiEncoding winAnsiEncoding;
	GlyphUnicodeMappingList::const_iterator it = inGlyphsList.begin(); 

	for(; it != inGlyphsList.end() && encodingResult.first; ++it)
	{
		// don't bother with characters of more (or less) than one unicode
		if(it->mUnicodeValues.size() != 1)
		{
			encodingResult.first = false;
		}
		else if(0x2022 == it->mUnicodeValues.front())
		{
			// From the reference:
			// In WinAnsiEncoding, all unused codes greater than 40 map to the bullet character. 
			// However, only code 225 is specifically assigned to the bullet character; other codes are subject to future reassignment.

			// now i don't know if it's related or not...but acrobat isn't happy when i'm using winansi with bullet. and text coming after that bullet may be
			// corrupted.
			// so i'm forcing CID if i hit bullet till i know better.
			encodingResult.first = false;
		}
		else
		{
			encodingResult = winAnsiEncoding.Encode(it->mUnicodeValues.front());
			if(encodingResult.first)
				ioCandidates.push_back(encodingResult.second);
		}
	}

	return encodingResult.first;
}